

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addPHIOperands(LLVMPointerGraphBuilder *this,Function *F)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator node_00;
  reference val;
  ret_type pPVar2;
  Function *in_RDI;
  PSNode *node;
  PHINode *PHI;
  Instruction *I;
  const_iterator __end3;
  const_iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *B;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  PSNode *in_stack_ffffffffffffffa0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_28;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_20 [4];
  
  local_20[0].NodePtr = (node_pointer)llvm::Function::begin(in_RDI);
  local_28.NodePtr = (node_pointer)llvm::Function::end(in_RDI);
  while (bVar1 = llvm::operator!=(local_20,&local_28), bVar1) {
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
    ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                 *)0x1b0ba1);
    this_00 = llvm::BasicBlock::begin((BasicBlock *)in_RDI);
    node_00 = llvm::BasicBlock::end((BasicBlock *)in_RDI);
    while (bVar1 = llvm::operator!=((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                                     *)&stack0xffffffffffffffc0,
                                    (ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                                     *)&stack0xffffffffffffffb8), bVar1) {
      val = llvm::
            ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
            ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                         *)0x1b0bed);
      pPVar2 = llvm::dyn_cast<llvm::PHINode,llvm::Instruction_const>
                         ((Instruction *)in_stack_ffffffffffffffa0);
      if (pPVar2 != (ret_type)0x0) {
        getNodes((LLVMPointerGraphBuilder *)node_00.NodePtr,(Value *)val);
        in_stack_ffffffffffffffa0 = PSNodesSeq::getSingleNode((PSNodesSeq *)0x1b0c1f);
        if (in_stack_ffffffffffffffa0 != (PSNode *)0x0) {
          addPHIOperands((LLVMPointerGraphBuilder *)this_00.NodePtr,(PSNode *)node_00.NodePtr,
                         (PHINode *)val);
        }
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                    *)in_stack_ffffffffffffffa0);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                  *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addPHIOperands(const llvm::Function &F) {
    for (const llvm::BasicBlock &B : F) {
        for (const llvm::Instruction &I : B) {
            if (const llvm::PHINode *PHI = llvm::dyn_cast<llvm::PHINode>(&I)) {
                if (PSNode *node = getNodes(PHI)->getSingleNode())
                    addPHIOperands(node, PHI);
            }
        }
    }
}